

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void freeList(list *list)

{
  token *__ptr;
  token *node;
  list *list_local;
  
  while (__ptr = list->first, __ptr != (token *)0x0) {
    list->first = list->first->next;
    free(__ptr->value);
    free(__ptr);
  }
  free(list);
  return;
}

Assistant:

void freeList(struct list *list)
{
    struct token *node;

    while ((node = list->first) != NULL) {
        list->first = list->first->next;
        free(node->value);
        free(node);
    }

    free(list);
}